

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::MmapInputFile::~MmapInputFile(MmapInputFile *this)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  (this->super_InputFile)._vptr_InputFile = (_func_int **)&PTR_TryOpen_005ff1f0;
  pcVar3 = (this->super_InputFile).data_._M_str;
  if (pcVar3 != (char *)0x0) {
    iVar1 = munmap(pcVar3,(this->super_InputFile).data_._M_len);
    __stream = _stderr;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"bloaty: error calling munmap(): %s\n",pcVar3);
    }
  }
  InputFile::~InputFile(&this->super_InputFile);
  return;
}

Assistant:

MmapInputFile::~MmapInputFile() {
  if (data_.data() != nullptr &&
      munmap(const_cast<char*>(data_.data()), data_.size()) != 0) {
    fprintf(stderr, "bloaty: error calling munmap(): %s\n", strerror(errno));
  }
}